

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjGen __thiscall QPDF::nextObjGen(QPDF *this)

{
  int iVar1;
  int iVar2;
  range_error *this_00;
  size_t local_28;
  int local_1c;
  QPDF *pQStack_18;
  int max_objid;
  QPDF *this_local;
  
  pQStack_18 = this;
  local_28 = getObjectCount(this);
  iVar1 = toI<unsigned_long>(&local_28);
  local_1c = iVar1;
  iVar2 = std::numeric_limits<int>::max();
  if (iVar1 == iVar2) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"max object id is too high to create new objects");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  QPDFObjGen::QPDFObjGen((QPDFObjGen *)&this_local,local_1c + 1,0);
  return (QPDFObjGen)this_local;
}

Assistant:

QPDFObjGen
QPDF::nextObjGen()
{
    int max_objid = toI(getObjectCount());
    if (max_objid == std::numeric_limits<int>::max()) {
        throw std::range_error("max object id is too high to create new objects");
    }
    return QPDFObjGen(max_objid + 1, 0);
}